

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_user_geometry.h
# Opt level: O1

PrimInfoMB * __thiscall
embree::avx::UserGeometryISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,UserGeometryISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined8 uVar1;
  BBox1f BVar2;
  PrimRefMB *pPVar3;
  bool bVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  undefined4 uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  float fVar21;
  ulong uVar22;
  float fVar23;
  ulong uVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  BBox<embree::Vec3fa> bupper1;
  BBox3fa box;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong local_208;
  undefined8 local_1f8;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 local_1e8;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  unsigned_long local_1b8;
  size_t local_1b0;
  size_t local_1a8;
  BBox1f *local_1a0;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  PrimInfoMB *local_c0;
  mvector<PrimRefMB> *local_b8;
  range<unsigned_long> *local_b0;
  void *local_a8;
  float fStack_a0;
  uint uStack_9c;
  undefined8 *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  float fStack_50;
  float fStack_4c;
  void *local_48;
  float local_40;
  int local_3c;
  void **local_38;
  
  fStack_11c = INFINITY;
  local_128._0_4_ = INFINITY;
  local_128._4_4_ = INFINITY;
  fStack_120 = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[3] = INFINITY;
  fStack_16c = -INFINITY;
  local_178._0_4_ = -INFINITY;
  local_178._4_4_ = -INFINITY;
  fStack_170 = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  auVar26._8_4_ = 0x3f800000;
  auVar26._0_8_ = &DAT_3f8000003f800000;
  auVar26._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar26);
  *(undefined8 *)&(__return_storage_ptr__->max_time_range).upper = uVar1;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar24 = r->_begin;
  local_1b0 = __return_storage_ptr__->num_time_segments;
  local_208 = __return_storage_ptr__->max_num_time_segments;
  local_148._0_8_ = __return_storage_ptr__->max_time_range;
  local_148._8_8_ = __return_storage_ptr__->time_range;
  auVar27._0_4_ = (__return_storage_ptr__->max_time_range).lower;
  auVar27._4_4_ = (__return_storage_ptr__->max_time_range).upper;
  auVar27._8_4_ = (__return_storage_ptr__->time_range).lower;
  auVar27._12_4_ = (__return_storage_ptr__->time_range).upper;
  local_c0 = __return_storage_ptr__;
  local_188._0_4_ = local_128._0_4_;
  local_188._4_4_ = local_128._4_4_;
  fStack_180 = fStack_120;
  fStack_17c = fStack_11c;
  local_168._0_4_ = local_128._0_4_;
  local_168._4_4_ = local_128._4_4_;
  fStack_160 = fStack_120;
  fStack_15c = fStack_11c;
  local_158._0_4_ = local_178._0_4_;
  local_158._4_4_ = local_178._4_4_;
  fStack_150 = fStack_170;
  fStack_14c = fStack_16c;
  local_138._0_4_ = local_178._0_4_;
  local_138._4_4_ = local_178._4_4_;
  fStack_130 = fStack_170;
  fStack_12c = fStack_16c;
  if (uVar24 < r->_end) {
    local_1b8 = (__return_storage_ptr__->object_range)._end;
    fStack_180 = INFINITY;
    local_188 = (undefined1  [8])0x7f8000007f800000;
    fStack_17c = INFINITY;
    fStack_170 = -INFINITY;
    local_178 = (undefined1  [8])0xff800000ff800000;
    fStack_16c = -INFINITY;
    fStack_120 = INFINITY;
    local_128 = (undefined1  [8])0x7f8000007f800000;
    fStack_11c = INFINITY;
    fStack_160 = INFINITY;
    local_168 = (undefined1  [8])0x7f8000007f800000;
    fStack_15c = INFINITY;
    fStack_130 = -INFINITY;
    local_138 = (undefined1  [8])0xff800000ff800000;
    fStack_12c = -INFINITY;
    fStack_150 = -INFINITY;
    local_158 = (undefined1  [8])0xff800000ff800000;
    fStack_14c = -INFINITY;
    local_1a8 = k;
    local_1a0 = t0t1;
    local_148 = auVar27;
    local_b8 = prims;
    local_b0 = r;
    do {
      BVar2 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
      auVar34._8_8_ = 0;
      auVar34._0_4_ = BVar2.lower;
      auVar34._4_4_ = BVar2.upper;
      fVar23 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
      fVar21 = BVar2.lower;
      auVar27 = vmovshdup_avx(auVar34);
      fVar11 = auVar27._0_4_ - fVar21;
      auVar27 = ZEXT416((uint)(fVar23 * ((local_1a0->lower - fVar21) / fVar11) * 1.0000002));
      auVar27 = vroundss_avx(auVar27,auVar27,9);
      auVar27 = vmaxss_avx(ZEXT816(0) << 0x40,auVar27);
      uVar19 = (uint)auVar27._0_4_;
      auVar27 = ZEXT416((uint)(fVar23 * ((local_1a0->upper - fVar21) / fVar11) * 0.99999976));
      auVar27 = vroundss_avx(auVar27,auVar27,10);
      auVar27 = vminss_avx(auVar27,ZEXT416((uint)fVar23));
      uVar16 = (uint)auVar27._0_4_;
      bVar4 = uVar16 < uVar19;
      fVar23 = (float)uVar24;
      if (uVar19 <= uVar16) {
        uVar22 = (ulong)(int)uVar19;
        do {
          local_1f8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
          local_1e8 = &local_e8;
          fStack_1f0 = fVar23;
          fStack_1ec = (float)uVar19;
          (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                    (&local_1f8);
          auVar10._4_4_ = fStack_e4;
          auVar10._0_4_ = local_e8;
          auVar10._8_4_ = fStack_e0;
          auVar10._12_4_ = fStack_dc;
          auVar13._4_4_ = fStack_d4;
          auVar13._0_4_ = local_d8;
          auVar13._8_4_ = fStack_d0;
          auVar13._12_4_ = fStack_cc;
          auVar30._8_4_ = 0xddccb9a2;
          auVar30._0_8_ = 0xddccb9a2ddccb9a2;
          auVar30._12_4_ = 0xddccb9a2;
          auVar27 = vcmpps_avx(auVar10,auVar30,6);
          auVar32._8_4_ = 0x5dccb9a2;
          auVar32._0_8_ = 0x5dccb9a25dccb9a2;
          auVar32._12_4_ = 0x5dccb9a2;
          auVar26 = vcmpps_avx(auVar13,auVar32,1);
          auVar27 = vandps_avx(auVar26,auVar27);
          auVar26 = vcmpps_avx(auVar10,auVar13,2);
          auVar27 = vandps_avx(auVar27,auVar26);
          uVar17 = vmovmskps_avx(auVar27);
          if ((~(byte)uVar17 & 7) != 0) {
            if (!bVar4) goto LAB_012ce032;
            break;
          }
          uVar22 = uVar22 + 1;
          uVar19 = uVar19 + 1;
          bVar4 = (ulong)(long)(int)uVar16 < uVar22;
        } while (uVar22 <= (ulong)(long)(int)uVar16);
      }
      fVar11 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
      fVar21 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.lower;
      fVar25 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.upper - fVar21;
      fVar29 = (local_1a0->lower - fVar21) / fVar25;
      fVar25 = (local_1a0->upper - fVar21) / fVar25;
      fVar21 = fVar11 * fVar29;
      local_1d8._0_4_ = fVar21;
      fVar9 = fVar11 * fVar25;
      auVar34 = vroundss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21),9);
      local_1c8._0_4_ = fVar9;
      auVar10 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),10);
      auVar27 = vmaxss_avx(auVar34,ZEXT816(0));
      local_f8._0_4_ = auVar27._0_4_;
      auVar26 = vminss_avx(auVar10,ZEXT416((uint)fVar11));
      fStack_1ec = (float)(int)auVar27._0_4_;
      uVar22 = (ulong)(uint)fStack_1ec;
      local_198._0_4_ = auVar26._0_4_;
      fVar21 = (float)(int)auVar26._0_4_;
      iVar20 = (int)auVar34._0_4_;
      if ((int)auVar34._0_4_ < 0) {
        iVar20 = -1;
      }
      iVar12 = (int)fVar11 + 1;
      if ((int)auVar10._0_4_ < (int)fVar11 + 1) {
        iVar12 = (int)auVar10._0_4_;
      }
      local_1f8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
      local_118._0_4_ = fStack_1ec;
      local_1e8 = &local_e8;
      fStack_1f0 = fVar23;
      (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_1f8);
      local_68 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
      local_108._0_4_ = fVar21;
      fStack_60 = fVar23;
      fStack_5c = fVar21;
      local_58 = &local_1f8;
      (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_68);
      if (iVar12 - iVar20 == 1) {
        auVar27 = vmaxss_avx(ZEXT416((uint)((float)local_1d8._0_4_ - (float)local_f8._0_4_)),
                             ZEXT816(0) << 0x40);
        auVar26 = vshufps_avx(auVar27,auVar27,0);
        auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
        auVar27 = vshufps_avx(auVar27,auVar27,0);
        auVar38._0_4_ = auVar26._0_4_ * (float)local_1f8 + auVar27._0_4_ * local_e8;
        auVar38._4_4_ = auVar26._4_4_ * local_1f8._4_4_ + auVar27._4_4_ * fStack_e4;
        auVar38._8_4_ = auVar26._8_4_ * fStack_1f0 + auVar27._8_4_ * fStack_e0;
        auVar38._12_4_ = auVar26._12_4_ * fStack_1ec + auVar27._12_4_ * fStack_dc;
        auVar39._0_4_ = auVar26._0_4_ * (float)local_1e8 + auVar27._0_4_ * local_d8;
        auVar39._4_4_ = auVar26._4_4_ * local_1e8._4_4_ + auVar27._4_4_ * fStack_d4;
        auVar39._8_4_ = auVar26._8_4_ * fStack_1e0 + auVar27._8_4_ * fStack_d0;
        auVar39._12_4_ = auVar26._12_4_ * fStack_1dc + auVar27._12_4_ * fStack_cc;
        auVar27 = vmaxss_avx(ZEXT416((uint)((float)local_198._0_4_ - (float)local_1c8._0_4_)),
                             ZEXT816(0) << 0x40);
        auVar26 = vshufps_avx(auVar27,auVar27,0);
        auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
        auVar27 = vshufps_avx(auVar27,auVar27,0);
        auVar31._0_4_ = auVar27._0_4_ * (float)local_1f8 + auVar26._0_4_ * local_e8;
        auVar31._4_4_ = auVar27._4_4_ * local_1f8._4_4_ + auVar26._4_4_ * fStack_e4;
        auVar31._8_4_ = auVar27._8_4_ * fStack_1f0 + auVar26._8_4_ * fStack_e0;
        auVar31._12_4_ = auVar27._12_4_ * fStack_1ec + auVar26._12_4_ * fStack_dc;
        auVar35._0_4_ = auVar27._0_4_ * (float)local_1e8 + auVar26._0_4_ * local_d8;
        auVar35._4_4_ = auVar27._4_4_ * local_1e8._4_4_ + auVar26._4_4_ * fStack_d4;
        auVar35._8_4_ = auVar27._8_4_ * fStack_1e0 + auVar26._8_4_ * fStack_d0;
        auVar35._12_4_ = auVar27._12_4_ * fStack_1dc + auVar26._12_4_ * fStack_cc;
      }
      else {
        fStack_7c = (float)(local_118._0_4_ + 1);
        local_88 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
        local_1d8._0_4_ = (float)local_1d8._0_4_ - (float)local_f8._0_4_;
        fStack_80 = fVar23;
        local_78 = &local_68;
        (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_88)
        ;
        uStack_9c = local_108._0_4_ - 1;
        uVar22 = (ulong)uStack_9c;
        local_a8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
        fStack_a0 = fVar23;
        local_98 = &local_88;
        (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_a8)
        ;
        auVar27 = vmaxss_avx(ZEXT416((uint)local_1d8._0_4_),ZEXT816(0) << 0x40);
        auVar26 = vshufps_avx(auVar27,auVar27,0);
        auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
        auVar27 = vshufps_avx(auVar27,auVar27,0);
        auVar38._0_4_ = auVar26._0_4_ * (float)local_68 + auVar27._0_4_ * local_e8;
        auVar38._4_4_ = auVar26._4_4_ * local_68._4_4_ + auVar27._4_4_ * fStack_e4;
        auVar38._8_4_ = auVar26._8_4_ * fStack_60 + auVar27._8_4_ * fStack_e0;
        auVar38._12_4_ = auVar26._12_4_ * fStack_5c + auVar27._12_4_ * fStack_dc;
        auVar39._0_4_ = auVar26._0_4_ * (float)local_58 + auVar27._0_4_ * local_d8;
        auVar39._4_4_ = auVar26._4_4_ * local_58._4_4_ + auVar27._4_4_ * fStack_d4;
        auVar39._8_4_ = auVar26._8_4_ * fStack_50 + auVar27._8_4_ * fStack_d0;
        auVar39._12_4_ = auVar26._12_4_ * fStack_4c + auVar27._12_4_ * fStack_cc;
        auVar27 = vmaxss_avx(ZEXT416((uint)((float)local_198._0_4_ - (float)local_1c8._0_4_)),
                             ZEXT816(0) << 0x40);
        auVar26 = vshufps_avx(auVar27,auVar27,0);
        auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
        auVar27 = vshufps_avx(auVar27,auVar27,0);
        auVar31._0_4_ = auVar26._0_4_ * (float)local_88 + auVar27._0_4_ * (float)local_1f8;
        auVar31._4_4_ = auVar26._4_4_ * local_88._4_4_ + auVar27._4_4_ * local_1f8._4_4_;
        auVar31._8_4_ = auVar26._8_4_ * fStack_80 + auVar27._8_4_ * fStack_1f0;
        auVar31._12_4_ = auVar26._12_4_ * fStack_7c + auVar27._12_4_ * fStack_1ec;
        auVar35._0_4_ = auVar26._0_4_ * (float)local_78 + auVar27._0_4_ * (float)local_1e8;
        auVar35._4_4_ = auVar26._4_4_ * local_78._4_4_ + auVar27._4_4_ * local_1e8._4_4_;
        auVar35._8_4_ = auVar26._8_4_ * fStack_70 + auVar27._8_4_ * fStack_1e0;
        auVar35._12_4_ = auVar26._12_4_ * fStack_6c + auVar27._12_4_ * fStack_1dc;
        iVar20 = iVar20 + 1;
        if (iVar20 < iVar12) {
          do {
            _local_1d8 = auVar39;
            auVar28._0_4_ = ((float)iVar20 / fVar11 - fVar29) / (fVar25 - fVar29);
            auVar28._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar27 = vshufps_avx(auVar28,auVar28,0);
            local_1c8._0_4_ = auVar31._0_4_;
            local_1c8._4_4_ = auVar31._4_4_;
            fStack_1c0 = auVar31._8_4_;
            fStack_1bc = auVar31._12_4_;
            auVar26 = vshufps_avx(ZEXT416((uint)(1.0 - auVar28._0_4_)),
                                  ZEXT416((uint)(1.0 - auVar28._0_4_)),0);
            local_108._0_4_ = auVar27._0_4_ * (float)local_1c8._0_4_ + auVar38._0_4_ * auVar26._0_4_
            ;
            local_108._4_4_ = auVar27._4_4_ * (float)local_1c8._4_4_ + auVar38._4_4_ * auVar26._4_4_
            ;
            local_108._8_4_ = auVar27._8_4_ * fStack_1c0 + auVar38._8_4_ * auVar26._8_4_;
            local_108._12_4_ = auVar27._12_4_ * fStack_1bc + auVar38._12_4_ * auVar26._12_4_;
            local_118._0_4_ = auVar35._0_4_ * auVar27._0_4_ + local_1d8._0_4_ * auVar26._0_4_;
            local_118._4_4_ = auVar35._4_4_ * auVar27._4_4_ + local_1d8._4_4_ * auVar26._4_4_;
            local_118._8_4_ = auVar35._8_4_ * auVar27._8_4_ + local_1d8._8_4_ * auVar26._8_4_;
            local_118._12_4_ = auVar35._12_4_ * auVar27._12_4_ + local_1d8._12_4_ * auVar26._12_4_;
            local_48 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
            _local_1c8 = auVar31;
            _local_198 = auVar38;
            _local_f8 = auVar35;
            local_40 = fVar23;
            local_3c = iVar20;
            local_38 = &local_a8;
            (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                      (&local_48);
            auVar14._8_4_ = fStack_a0;
            auVar14._0_8_ = local_a8;
            auVar14._12_4_ = uStack_9c;
            auVar27 = vsubps_avx(auVar14,local_108);
            auVar15._8_8_ = uStack_90;
            auVar15._0_8_ = local_98;
            auVar34 = vsubps_avx(auVar15,local_118);
            auVar26 = vminps_avx(auVar27,ZEXT816(0) << 0x40);
            auVar27 = vmaxps_avx(auVar34,ZEXT816(0) << 0x40);
            auVar38._0_4_ = (float)local_198._0_4_ + auVar26._0_4_;
            auVar38._4_4_ = (float)local_198._4_4_ + auVar26._4_4_;
            auVar38._8_4_ = fStack_190 + auVar26._8_4_;
            auVar38._12_4_ = fStack_18c + auVar26._12_4_;
            auVar31._0_4_ = (float)local_1c8._0_4_ + auVar26._0_4_;
            auVar31._4_4_ = (float)local_1c8._4_4_ + auVar26._4_4_;
            auVar31._8_4_ = fStack_1c0 + auVar26._8_4_;
            auVar31._12_4_ = fStack_1bc + auVar26._12_4_;
            auVar39._0_4_ = (float)local_1d8._0_4_ + auVar27._0_4_;
            auVar39._4_4_ = (float)local_1d8._4_4_ + auVar27._4_4_;
            auVar39._8_4_ = fStack_1d0 + auVar27._8_4_;
            auVar39._12_4_ = fStack_1cc + auVar27._12_4_;
            auVar35._0_4_ = (float)local_f8._0_4_ + auVar27._0_4_;
            auVar35._4_4_ = (float)local_f8._4_4_ + auVar27._4_4_;
            auVar35._8_4_ = fStack_f0 + auVar27._8_4_;
            auVar35._12_4_ = fStack_ec + auVar27._12_4_;
            iVar20 = iVar20 + 1;
          } while (iVar12 != iVar20);
        }
      }
      aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar38,ZEXT416(geomID),0x30);
      uVar16 = (this->super_UserGeometry).super_AccelSet.super_Geometry.numTimeSteps - 1;
      uVar18 = (ulong)uVar16;
      aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar39,ZEXT416((uint)fVar23),0x30);
      aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar31,ZEXT416(uVar16),0x30);
      aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar35,ZEXT416(uVar16),0x30);
      auVar33._0_4_ = aVar5.x * 0.5 + aVar7.x * 0.5 + aVar6.x * 0.5 + aVar8.x * 0.5;
      auVar33._4_4_ = aVar5.y * 0.5 + aVar7.y * 0.5 + aVar6.y * 0.5 + aVar8.y * 0.5;
      auVar33._8_4_ = aVar5.z * 0.5 + aVar7.z * 0.5 + aVar6.z * 0.5 + aVar8.z * 0.5;
      auVar33._12_4_ =
           aVar5.field_3.w * 0.5 + aVar7.field_3.w * 0.5 +
           aVar6.field_3.w * 0.5 + aVar8.field_3.w * 0.5;
      _local_128 = vminps_avx(_local_128,(undefined1  [16])aVar5);
      _local_138 = vmaxps_avx(_local_138,(undefined1  [16])aVar6);
      _local_188 = vminps_avx(_local_188,(undefined1  [16])aVar7);
      _local_178 = vmaxps_avx(_local_178,(undefined1  [16])aVar8);
      _local_168 = vminps_avx(_local_168,auVar33);
      _local_158 = vmaxps_avx(_local_158,auVar33);
      auVar27 = vshufpd_avx(local_148,local_148,1);
      BVar2 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
      auVar36._8_4_ = BVar2.lower;
      auVar36._12_4_ = BVar2.upper;
      auVar36._0_4_ = BVar2.lower;
      auVar36._4_4_ = BVar2.upper;
      auVar27 = vcmpps_avx(auVar27,auVar36,1);
      local_1b8 = local_1b8 + 1;
      local_1b0 = local_1b0 + uVar18;
      auVar27 = vshufps_avx(ZEXT416((uint)CONCAT71((int7)(uVar22 >> 8),local_208 < uVar18)),auVar27,
                            0x40);
      auVar34 = vpslld_avx(auVar27,0x1f);
      auVar37._8_8_ = local_148._8_8_;
      auVar37._0_4_ = BVar2.lower;
      auVar37._4_4_ = BVar2.upper;
      auVar26 = vshufps_avx(auVar37,auVar37,100);
      auVar27 = vblendps_avx(local_148,auVar36,4);
      local_148 = vblendvps_avx(auVar27,auVar26,auVar34);
      if (local_208 <= uVar18) {
        local_208 = uVar18;
      }
      pPVar3 = local_b8->items;
      pPVar3[local_1a8].lbounds.bounds0.lower.field_0.field_1 = aVar5;
      pPVar3[local_1a8].lbounds.bounds0.upper.field_0.field_1 = aVar6;
      pPVar3[local_1a8].lbounds.bounds1.lower.field_0.field_1 = aVar7;
      pPVar3[local_1a8].lbounds.bounds1.upper.field_0.field_1 = aVar8;
      BVar2 = (BBox1f)vmovlpd_avx(auVar36);
      pPVar3[local_1a8].time_range = BVar2;
      local_1a8 = local_1a8 + 1;
LAB_012ce032:
      uVar24 = uVar24 + 1;
    } while (uVar24 < local_b0->_end);
    (local_c0->object_range)._end = local_1b8;
  }
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0.m128
  [0] = (float)local_128._0_4_;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0.m128
  [1] = (float)local_128._4_4_;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0.m128
  [2] = fStack_120;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0.m128
  [3] = fStack_11c;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.field_0.m128
  [0] = (float)local_138._0_4_;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.field_0.m128
  [1] = (float)local_138._4_4_;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.field_0.m128
  [2] = fStack_130;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.field_0.m128
  [3] = fStack_12c;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.field_0.m128
  [0] = (float)local_188._0_4_;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.field_0.m128
  [1] = (float)local_188._4_4_;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.field_0.m128
  [2] = fStack_180;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.field_0.m128
  [3] = fStack_17c;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.field_0.m128
  [0] = (float)local_178._0_4_;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.field_0.m128
  [1] = (float)local_178._4_4_;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.field_0.m128
  [2] = fStack_170;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.field_0.m128
  [3] = fStack_16c;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128[0] =
       (float)local_168._0_4_;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128[1] =
       (float)local_168._4_4_;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128[2] =
       fStack_160;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128[3] =
       fStack_15c;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[0] =
       (float)local_158._0_4_;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[1] =
       (float)local_158._4_4_;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[2] =
       fStack_150;
  (local_c0->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[3] =
       fStack_14c;
  local_c0->num_time_segments = local_1b0;
  local_c0->max_num_time_segments = local_208;
  local_c0->max_time_range = (BBox1f)local_148._0_8_;
  local_c0->time_range = (BBox1f)local_148._8_8_;
  return local_c0;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const PrimRefMB prim(linearBounds(j,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }